

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

bool __thiscall
absl::numbers_internal::safe_strto8_base
          (numbers_internal *this,string_view text,int8_t *value,int base)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  char cVar5;
  bool local_3d;
  uint local_3c;
  string_view local_38;
  
  local_38._M_str = (char *)text._M_len;
  local_3c = (uint)value;
  *text._M_str = '\0';
  local_38._M_len = (size_t)this;
  bVar2 = anon_unknown_0::safe_parse_sign_and_base(&local_38,(int *)&local_3c,&local_3d);
  if (bVar2) {
    bVar4 = (byte)local_3c;
    if (local_3d == false) {
      if ((int)local_3c < 0) {
        __assert_fail("base >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                      ,0x3dc,
                      "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType * _Nonnull) [IntType = signed char]"
                     );
      }
      if ((1 < local_3c) &&
         ((char)(0x7f / (short)(char)bVar4) !=
          (anonymous_namespace)::LookupTables<signed_char>::kVmaxOverBase[local_3c])) {
        __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                      ,0x3e1,
                      "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType * _Nonnull) [IntType = signed char]"
                     );
      }
      local_38._M_len = local_38._M_len + (long)local_38._M_str;
      cVar3 = '\0';
      for (; bVar2 = local_38._M_len <= local_38._M_str, cVar5 = cVar3, !bVar2;
          local_38._M_str = (char *)((numbers_internal *)local_38._M_str + 1)) {
        cVar1 = (anonymous_namespace)::kAsciiToInt[(byte)*local_38._M_str];
        if ((((int)(char)bVar4 <= (int)cVar1) ||
            (cVar5 = '\x7f',
            (char)(anonymous_namespace)::LookupTables<signed_char>::kVmaxOverBase[local_3c] < cVar3)
            ) || (0x7f - cVar1 < (int)(char)(cVar3 * bVar4))) break;
        cVar3 = cVar1 + cVar3 * bVar4;
      }
    }
    else {
      if (0x80 < (int)local_3c) {
        __assert_fail("vmin <= 0 - base",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                      ,0x401,
                      "bool absl::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, IntType * _Nonnull) [IntType = signed char]"
                     );
      }
      if ((1 < (int)local_3c) &&
         ((uint)(0x80 / bVar4) +
          (int)(char)(anonymous_namespace)::LookupTables<signed_char>::kVminOverBase[(int)local_3c]
          != 0)) {
        __assert_fail("base < 2 || std::numeric_limits<IntType>::min() / base == vmin_over_base",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                      ,0x404,
                      "bool absl::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, IntType * _Nonnull) [IntType = signed char]"
                     );
      }
      local_38._M_len = local_38._M_len + (long)local_38._M_str;
      cVar3 = '\0';
      for (; bVar2 = local_38._M_len <= local_38._M_str, cVar5 = cVar3, !bVar2;
          local_38._M_str = (char *)((numbers_internal *)local_38._M_str + 1)) {
        cVar1 = (anonymous_namespace)::kAsciiToInt[(byte)*local_38._M_str];
        if ((((int)local_3c <= (int)cVar1) ||
            (cVar5 = -0x80,
            cVar3 < (char)(anonymous_namespace)::LookupTables<signed_char>::kVminOverBase
                          [(int)local_3c])) || ((int)(char)(cVar3 * bVar4) < cVar1 + -0x80)) break;
        cVar3 = cVar3 * bVar4 - cVar1;
      }
    }
    *text._M_str = cVar5;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool safe_strto8_base(absl::string_view text, int8_t* absl_nonnull value,
                      int base) {
  return safe_int_internal<int8_t>(text, value, base);
}